

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

void __thiscall lzham::vector<unsigned_short>::clear(vector<unsigned_short> *this)

{
  long *in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  if (*in_RDI != 0) {
    scalar_type<unsigned_short>::destruct_array((unsigned_short *)*in_RDI,*(uint *)(in_RDI + 1));
    lzham_free(in_RDI,in_stack_ffffffffffffffe8);
    *in_RDI = 0;
    *(undefined4 *)(in_RDI + 1) = 0;
    *(undefined4 *)((long)in_RDI + 0xc) = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            lzham_free(m_malloc_context, m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }